

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingBoostTypes.cpp
# Opt level: O0

int main(void)

{
  initializer_list<std::pair<const_int,_int>_> il;
  initializer_list<int> il_00;
  initializer_list<std::pair<int,_int>_> il_01;
  initializer_list<int> il_02;
  initializer_list<int> il_03;
  initializer_list<int> il_04;
  initializer_list<int> il_05;
  char acVar1 [9];
  char acVar2 [9];
  char acVar3 [9];
  char acVar4 [9];
  cx_string<8UL> cVar5;
  cx_string<8UL> cVar6;
  cx_string<8UL> cVar7;
  cx_string<8UL> cVar8;
  Severity SVar9;
  cx_string<2UL> cVar10;
  SessionWriter *pSVar11;
  data_ref pacVar12;
  data_ref pacVar13;
  data_ref pacVar14;
  int *p;
  undefined4 *puVar15;
  cx_string<14UL> cVar16;
  uint64_t _binlog_sid_v_5;
  optional<int> bemptyOpt;
  optional<int> bopt;
  uint64_t _binlog_sid_v_4;
  uint64_t _binlog_sid_v_3;
  shared_ptr<int> bshared;
  scoped_ptr<int> bscoped;
  uint64_t _binlog_sid_v_2;
  string str;
  uint64_t _binlog_sid_v_1;
  flat_set<int,_std::less<int>,_void> bfs;
  flat_map<int,_int,_std::less<int>,_void> bfm;
  set<int,_std::less<int>,_void,_void> bs;
  map<int,_int,_std::less<int>,_void,_void> bm;
  uint64_t _binlog_sid_v;
  vector<int,_void,_void> bv;
  slist<int,_void> bsl;
  list<int,_void> bl;
  deque<int,_void,_void> bdq;
  memory_order __b_10;
  memory_order __b_8;
  memory_order __b_6;
  memory_order __b_4;
  memory_order __b_2;
  memory_order __b;
  memory_order __b_11;
  memory_order __b_9;
  memory_order __b_7;
  memory_order __b_5;
  memory_order __b_3;
  memory_order __b_1;
  shared_ptr<int> *in_stack_fffffffffffff198;
  EventSource *in_stack_fffffffffffff1a0;
  iterator in_stack_fffffffffffff1a8;
  __atomic_base<unsigned_long> _Var17;
  SessionWriter *in_stack_fffffffffffff1b0;
  allocator_type *in_stack_fffffffffffff1b8;
  atomic<unsigned_long> *in_stack_fffffffffffff1c0;
  undefined4 in_stack_fffffffffffff1c8;
  undefined4 in_stack_fffffffffffff1cc;
  Session *in_stack_fffffffffffff1d0;
  allocator_type *in_stack_fffffffffffff1d8;
  allocator *paVar18;
  deque<int,_void,_void> *in_stack_fffffffffffff1e0;
  map<int,_int,_std::less<int>,_void,_void> *in_stack_fffffffffffff1e8;
  string *this;
  undefined7 in_stack_fffffffffffff1f0;
  undefined1 in_stack_fffffffffffff1f7;
  allocator local_921;
  char local_920 [9];
  cx_string<8UL> local_910;
  allocator local_904;
  allocator local_903;
  allocator local_902;
  allocator local_901;
  undefined8 local_900;
  undefined2 local_8f8;
  string local_8f0 [32];
  string local_8d0 [32];
  string local_8b0 [32];
  undefined8 local_890;
  string local_888 [32];
  string local_868 [32];
  __atomic_base<unsigned_long> local_848;
  undefined4 local_834;
  scoped_ptr<bool> local_828;
  undefined1 local_81d;
  undefined1 local_81c;
  undefined1 local_81b;
  undefined1 local_81a;
  allocator local_819;
  char local_818 [9];
  scoped_ptr<bool> local_808;
  cx_string<8UL> local_800;
  allocator local_7f4;
  allocator local_7f3;
  allocator local_7f2;
  allocator local_7f1;
  undefined8 local_7f0;
  undefined2 local_7e8;
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  undefined8 local_780;
  string local_778 [32];
  string local_758 [32];
  __atomic_base<unsigned_long> local_738;
  undefined1 local_72d;
  undefined1 local_72c;
  undefined1 local_72b;
  undefined1 local_72a;
  allocator local_729;
  char local_728 [9];
  cx_string<8UL> local_718;
  allocator local_70c;
  allocator local_70b;
  allocator local_70a;
  allocator local_709;
  undefined8 local_708;
  undefined2 local_700;
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  undefined8 local_698;
  string local_690 [32];
  string local_670 [32];
  __atomic_base<unsigned_long> local_650;
  scoped_ptr<int> local_638;
  undefined1 local_62c;
  undefined1 local_62b;
  undefined1 local_62a;
  undefined1 local_629;
  allocator local_628;
  cx_string<2UL> local_627;
  allocator local_624;
  allocator local_623;
  allocator local_622;
  allocator local_621;
  undefined8 local_620;
  undefined2 local_618;
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  undefined8 local_5b0;
  string local_5a8 [32];
  string local_588 [32];
  __atomic_base<unsigned_long> local_568;
  undefined1 local_545;
  undefined1 local_544;
  undefined1 local_543;
  undefined1 local_542;
  allocator local_541;
  char local_540 [7];
  char cStack_539;
  undefined4 local_538;
  undefined2 local_534;
  char local_532;
  cx_string<14UL> local_530;
  allocator local_51c;
  allocator local_51b;
  allocator local_51a;
  allocator local_519;
  undefined8 local_518;
  undefined2 local_510;
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  undefined8 local_4a8;
  string local_4a0 [32];
  string local_480 [32];
  __atomic_base<unsigned_long> local_460;
  undefined4 local_458;
  undefined4 local_454;
  undefined4 local_450;
  undefined4 local_44c;
  undefined4 *local_448;
  undefined8 local_440;
  undefined1 local_438 [56];
  pair<int,_int> local_400;
  pair<int,_int> local_3f8;
  undefined1 *local_3f0;
  undefined8 local_3e8;
  shared_ptr<int> local_3e0;
  undefined4 local_3c4;
  undefined4 local_3c0;
  undefined4 local_3bc;
  undefined4 *local_3b8;
  undefined8 local_3b0;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 *local_370;
  undefined8 local_368;
  undefined1 local_33d;
  undefined1 local_33c;
  undefined1 local_33b;
  undefined1 local_33a;
  allocator local_339;
  char local_338 [9];
  cx_string<8UL> local_328;
  allocator local_31c;
  allocator local_31b;
  allocator local_31a;
  allocator local_319;
  undefined8 local_318;
  undefined2 local_310;
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  undefined8 local_2a8;
  string local_2a0 [32];
  string local_280 [32];
  __atomic_base<unsigned_long> local_260;
  undefined1 local_258 [28];
  undefined4 local_23c;
  undefined4 local_238;
  undefined4 local_234;
  undefined4 *local_230;
  undefined8 local_228;
  shared_ptr<int> local_220 [2];
  new_allocator<int> local_1fd;
  undefined4 local_1fc;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 *local_1f0;
  uint64_t local_1e8;
  new_allocator<int> local_1c5;
  undefined4 local_1c4;
  undefined4 local_1c0;
  undefined4 local_1bc;
  undefined4 *local_1b8;
  undefined8 local_1b0;
  int local_154;
  __atomic_base<unsigned_long> local_150;
  memory_order local_148;
  undefined4 local_144;
  atomic<unsigned_long> *local_140;
  __atomic_base<unsigned_long> local_138;
  memory_order local_130;
  undefined4 local_12c;
  atomic<unsigned_long> *local_128;
  __atomic_base<unsigned_long> local_120;
  memory_order local_118;
  undefined4 local_114;
  atomic<unsigned_long> *local_110;
  __atomic_base<unsigned_long> local_108;
  memory_order local_100;
  undefined4 local_fc;
  atomic<unsigned_long> *local_f8;
  __atomic_base<unsigned_long> local_f0;
  memory_order local_e8;
  undefined4 local_e4;
  atomic<unsigned_long> *local_e0;
  __atomic_base<unsigned_long> local_d8;
  memory_order local_d0;
  undefined4 local_cc;
  atomic<unsigned_long> *local_c8;
  Session *local_c0;
  memory_order local_b8;
  int local_b4;
  Session *local_b0;
  atomic<unsigned_long> *local_a8;
  __int_type local_a0;
  memory_order local_98;
  int local_94;
  __atomic_base<unsigned_long> local_90;
  atomic<unsigned_long> *local_88;
  __int_type local_80;
  memory_order local_78;
  int local_74;
  __atomic_base<unsigned_long> local_70;
  atomic<unsigned_long> *local_68;
  __int_type local_60;
  memory_order local_58;
  int local_54;
  __atomic_base<unsigned_long> local_50;
  atomic<unsigned_long> *local_48;
  __int_type local_40;
  memory_order local_38;
  int local_34;
  __atomic_base<unsigned_long> local_30;
  atomic<unsigned_long> *local_28;
  __int_type local_20;
  memory_order local_18;
  int local_14;
  __atomic_base<unsigned_long> local_10;
  atomic<unsigned_long> *local_8;
  
  local_154 = 0;
  local_1c4 = 1;
  local_1c0._0_1_ = (string)0x2;
  local_1c0._1_3_ = 0;
  local_1bc = 3;
  local_1b8 = &local_1c4;
  local_1b0 = 3;
  boost::container::new_allocator<int>::new_allocator(&local_1c5);
  il_03._M_array._4_4_ = in_stack_fffffffffffff1cc;
  il_03._M_array._0_4_ = in_stack_fffffffffffff1c8;
  il_03._M_len = (size_type)in_stack_fffffffffffff1d0;
  boost::container::deque<int,_void,_void>::deque
            ((deque<int,_void,_void> *)in_stack_fffffffffffff1c0,il_03,in_stack_fffffffffffff1b8);
  local_1fc = 7;
  local_1f8 = 8;
  local_1f4 = 9;
  local_1f0 = &local_1fc;
  local_1e8 = 3;
  boost::container::new_allocator<int>::new_allocator(&local_1fd);
  il_04._M_len._0_7_ = in_stack_fffffffffffff1f0;
  il_04._M_array = (iterator)in_stack_fffffffffffff1e8;
  il_04._M_len._7_1_ = in_stack_fffffffffffff1f7;
  boost::container::list<int,_void>::list
            ((list<int,_void> *)in_stack_fffffffffffff1e0,il_04,in_stack_fffffffffffff1d8);
  local_23c = 10;
  local_238 = 0x14;
  local_234 = 0x1e;
  local_230 = &local_23c;
  local_228._0_1_ = (string)0x3;
  local_228._1_7_ = 0;
  boost::container::new_allocator<int>::new_allocator((new_allocator<int> *)(local_258 + 0x1b));
  il_05._M_len._0_7_ = in_stack_fffffffffffff1f0;
  il_05._M_array = (iterator)in_stack_fffffffffffff1e8;
  il_05._M_len._7_1_ = in_stack_fffffffffffff1f7;
  boost::container::slist<int,_void>::slist
            ((slist<int,_void> *)in_stack_fffffffffffff1e0,il_05,in_stack_fffffffffffff1d8);
  boost::container::vector<int,_void,_void>::vector((vector<int,_void,_void> *)0x1036a8);
  pSVar11 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar11);
  SVar9 = binlog::Session::minSeverity((Session *)0x1036db);
  cVar5._data[8] = local_328._data[8];
  cVar5._data[0] = local_328._data[0];
  cVar5._data[1] = local_328._data[1];
  cVar5._data[2] = local_328._data[2];
  cVar5._data[3] = local_328._data[3];
  cVar5._data[4] = local_328._data[4];
  cVar5._data[5] = local_328._data[5];
  cVar5._data[6] = local_328._data[6];
  cVar5._data[7] = local_328._data[7];
  acVar1[8] = local_338[8];
  acVar1[0] = local_338[0];
  acVar1[1] = local_338[1];
  acVar1[2] = local_338[2];
  acVar1[3] = local_338[3];
  acVar1[4] = local_338[4];
  acVar1[5] = local_338[5];
  acVar1[6] = local_338[6];
  acVar1[7] = local_338[7];
  if (SVar9 < 0x81) {
    local_c8 = &main::_binlog_sid;
    local_cc = 0;
    local_d0 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_d8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_260 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar11 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar11);
      local_318 = 0;
      local_310 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_308,"main",&local_319);
      local_33d = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e8,"main",&local_31a);
      local_33c = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingBoostTypes.cpp"
                 ,&local_31b);
      local_33b = 1;
      local_2a8 = 0x26;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a0,"Boost sequence containers: {} {} {} {}",&local_31c);
      local_33a = 1;
      local_338 = (char  [9])
                  binlog::detail::
                  concatenated_tags<char_const(&)[39],boost::container::deque<int,void,void>&,boost::container::list<int,void>&,boost::container::slist<int,void>&,boost::container::vector<int,void,void>&>
                            ((char (*) [39])in_stack_fffffffffffff1e0,
                             (deque<int,_void,_void> *)in_stack_fffffffffffff1d8,
                             (list<int,_void> *)in_stack_fffffffffffff1d0,
                             (slist<int,_void> *)
                             CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8),
                             (vector<int,_void,_void> *)in_stack_fffffffffffff1c0);
      local_328 = (cx_string<8UL>)local_338;
      pacVar12 = mserialize::cx_string<8UL>::data(&local_328);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,*pacVar12,&local_339);
      local_33a = 0;
      local_33b = 0;
      local_33c = 0;
      local_33d = 0;
      local_260._M_i =
           binlog::Session::addEventSource
                     (in_stack_fffffffffffff1d0,
                      (EventSource *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      binlog::EventSource::~EventSource(in_stack_fffffffffffff1a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_339);
      std::allocator<char>::~allocator((allocator<char> *)&local_31c);
      std::allocator<char>::~allocator((allocator<char> *)&local_31b);
      std::allocator<char>::~allocator((allocator<char> *)&local_31a);
      std::allocator<char>::~allocator((allocator<char> *)&local_319);
      local_8 = &main::_binlog_sid;
      local_10._M_i = local_260._M_i;
      local_14 = 5;
      local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_20 = local_10._M_i;
      if ((local_14 != 3) && (local_14 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_10._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    in_stack_fffffffffffff1a0 = (EventSource *)local_258;
    in_stack_fffffffffffff198 = local_220;
    binlog::detail::
    addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[39],boost::container::deque<int,void,void>&,boost::container::list<int,void>&,boost::container::slist<int,void>&,boost::container::vector<int,void,void>&>
              ((SessionWriter *)in_stack_fffffffffffff1c0,(uint64_t)in_stack_fffffffffffff1b8,
               (uint64_t)in_stack_fffffffffffff1b0,(char (*) [39])in_stack_fffffffffffff1a8,
               (deque<int,_void,_void> *)in_stack_fffffffffffff1a0,
               (list<int,_void> *)in_stack_fffffffffffff198,
               (slist<int,_void> *)in_stack_fffffffffffff1d0,
               (vector<int,_void,_void> *)in_stack_fffffffffffff1d8);
    acVar1 = local_338;
    cVar5._data = local_328._data;
  }
  local_388 = 0x100000001;
  uStack_380 = 0x400000002;
  local_378 = 0x900000003;
  local_370 = &local_388;
  local_368 = 3;
  il._M_len = (size_type)in_stack_fffffffffffff1b0;
  il._M_array = in_stack_fffffffffffff1a8;
  local_338 = acVar1;
  local_328._data = cVar5._data;
  boost::container::map<int,_int,_std::less<int>,_void,_void>::map
            ((map<int,_int,_std::less<int>,_void,_void> *)in_stack_fffffffffffff1a0,il);
  local_3c4 = 4;
  local_3c0._0_1_ = (string)0x5;
  local_3c0._1_3_ = 0;
  local_3bc = 6;
  local_3b8 = &local_3c4;
  local_3b0 = 3;
  il_00._M_len = (size_type)in_stack_fffffffffffff1b0;
  il_00._M_array = &in_stack_fffffffffffff1a8->first;
  boost::container::set<int,_std::less<int>,_void,_void>::set
            ((set<int,_std::less<int>,_void,_void> *)in_stack_fffffffffffff1a0,il_00);
  local_438._44_4_ = 1;
  local_438._40_4_ = 1;
  std::pair<int,_int>::pair<int,_int,_true>
            ((pair<int,_int> *)(local_438 + 0x30),(int *)(local_438 + 0x2c),
             (int *)(local_438 + 0x28));
  local_438._36_4_ = 2;
  local_438._32_4_ = 4;
  std::pair<int,_int>::pair<int,_int,_true>
            (&local_400,(int *)(local_438 + 0x24),(int *)(local_438 + 0x20));
  local_438._28_4_ = 3;
  local_438._24_4_ = 9;
  std::pair<int,_int>::pair<int,_int,_true>
            (&local_3f8,(int *)(local_438 + 0x1c),(int *)(local_438 + 0x18));
  local_3f0 = local_438 + 0x30;
  local_3e8._0_1_ = (string)0x3;
  local_3e8._1_7_ = 0;
  il_01._M_len = (size_type)in_stack_fffffffffffff1b0;
  il_01._M_array = (iterator)in_stack_fffffffffffff1a8;
  boost::container::flat_map<int,_int,_std::less<int>,_void>::flat_map
            ((flat_map<int,_int,_std::less<int>,_void> *)in_stack_fffffffffffff1a0,il_01);
  local_458 = 2;
  local_454 = 3;
  local_450 = 5;
  local_44c = 8;
  local_448 = &local_458;
  local_440 = 4;
  il_02._M_len = (size_type)in_stack_fffffffffffff1b0;
  il_02._M_array = &in_stack_fffffffffffff1a8->first;
  boost::container::flat_set<int,_std::less<int>,_void>::flat_set
            ((flat_set<int,_std::less<int>,_void> *)in_stack_fffffffffffff1a0,il_02);
  pSVar11 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar11);
  SVar9 = binlog::Session::minSeverity((Session *)0x103fe6);
  if (SVar9 < 0x81) {
    local_e0 = &main::_binlog_sid;
    local_e4 = 0;
    local_e8 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_f0 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_460 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar11 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar11);
      local_518 = 0;
      local_510 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_508,"main",&local_519);
      local_545 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4e8,"main",&local_51a);
      local_544 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingBoostTypes.cpp"
                 ,&local_51b);
      local_543 = 1;
      local_4a8 = 0x2d;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4a0,"Boost associative containers: {} {} {} {}",&local_51c)
      ;
      local_542 = 1;
      cVar16 = binlog::detail::
               concatenated_tags<char_const(&)[42],boost::container::map<int,int,std::less<int>,void,void>&,boost::container::set<int,std::less<int>,void,void>&,boost::container::flat_map<int,int,std::less<int>,void>&,boost::container::flat_set<int,std::less<int>,void>&>
                         ((char (*) [42])
                          CONCAT17(in_stack_fffffffffffff1f7,in_stack_fffffffffffff1f0),
                          in_stack_fffffffffffff1e8,
                          (set<int,_std::less<int>,_void,_void> *)in_stack_fffffffffffff1e0,
                          (flat_map<int,_int,_std::less<int>,_void> *)in_stack_fffffffffffff1d8,
                          (flat_set<int,_std::less<int>,_void> *)in_stack_fffffffffffff1d0);
      local_530._data._8_7_ = cVar16._data._8_7_;
      local_532 = cVar16._data[0xe];
      local_534 = cVar16._data._12_2_;
      local_538 = cVar16._data._8_4_;
      local_540 = cVar16._data._0_7_;
      cStack_539 = cVar16._data[7];
      local_530._data._0_7_ = local_540;
      local_530._data[7] = cStack_539;
      pacVar13 = mserialize::cx_string<14UL>::data(&local_530);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_480,*pacVar13,&local_541);
      local_542 = 0;
      local_543 = 0;
      local_544 = 0;
      local_545 = 0;
      local_460._M_i =
           binlog::Session::addEventSource
                     (in_stack_fffffffffffff1d0,
                      (EventSource *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      binlog::EventSource::~EventSource(in_stack_fffffffffffff1a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_541);
      std::allocator<char>::~allocator((allocator<char> *)&local_51c);
      std::allocator<char>::~allocator((allocator<char> *)&local_51b);
      std::allocator<char>::~allocator((allocator<char> *)&local_51a);
      std::allocator<char>::~allocator((allocator<char> *)&local_519);
      local_28 = &main::_binlog_sid;
      local_30._M_i = local_460._M_i;
      local_34 = 5;
      local_38 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_40 = local_30._M_i;
      if ((local_34 != 3) && (local_34 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_30._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    in_stack_fffffffffffff1a0 = (EventSource *)local_438;
    in_stack_fffffffffffff198 = &local_3e0;
    binlog::detail::
    addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[42],boost::container::map<int,int,std::less<int>,void,void>&,boost::container::set<int,std::less<int>,void,void>&,boost::container::flat_map<int,int,std::less<int>,void>&,boost::container::flat_set<int,std::less<int>,void>&>
              ((SessionWriter *)in_stack_fffffffffffff1c0,(uint64_t)in_stack_fffffffffffff1b8,
               (uint64_t)in_stack_fffffffffffff1b0,(char (*) [42])in_stack_fffffffffffff1a8,
               (map<int,_int,_std::less<int>,_void,_void> *)in_stack_fffffffffffff1a0,
               (set<int,_std::less<int>,_void,_void> *)in_stack_fffffffffffff198,
               (flat_map<int,_int,_std::less<int>,_void> *)in_stack_fffffffffffff1d0,
               (flat_set<int,_std::less<int>,_void> *)in_stack_fffffffffffff1d8);
  }
  boost::container::basic_string<char,_std::char_traits<char>,_void>::basic_string
            ((basic_string<char,_std::char_traits<char>,_void> *)in_stack_fffffffffffff1d0,
             (char *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
  pSVar11 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar11);
  SVar9 = binlog::Session::minSeverity((Session *)0x104748);
  if (SVar9 < 0x81) {
    local_f8 = &main::_binlog_sid;
    local_fc = 0;
    local_100 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_108 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_568 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar11 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar11);
      local_620 = 0;
      local_618 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_610,"main",&local_621);
      local_62c = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5f0,"main",&local_622);
      local_62b = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_5d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingBoostTypes.cpp"
                 ,&local_623);
      local_62a = 1;
      local_5b0 = 0x33;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5a8,"Boost string: {}",&local_624);
      local_629 = 1;
      cVar10 = binlog::detail::
               concatenated_tags<char_const(&)[17],boost::container::basic_string<char,std::char_traits<char>,void>&>
                         ((char (*) [17])in_stack_fffffffffffff1a8,
                          (basic_string<char,_std::char_traits<char>,_void> *)
                          in_stack_fffffffffffff1a0);
      local_627._data._0_2_ = cVar10._data._0_2_;
      local_627._data[2] = cVar10._data[2];
      pacVar14 = mserialize::cx_string<2UL>::data(&local_627);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_588,*pacVar14,&local_628);
      local_629 = 0;
      local_62a = 0;
      local_62b = 0;
      local_62c = 0;
      local_568._M_i =
           binlog::Session::addEventSource
                     (in_stack_fffffffffffff1d0,
                      (EventSource *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      binlog::EventSource::~EventSource(in_stack_fffffffffffff1a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_628);
      std::allocator<char>::~allocator((allocator<char> *)&local_624);
      std::allocator<char>::~allocator((allocator<char> *)&local_623);
      std::allocator<char>::~allocator((allocator<char> *)&local_622);
      std::allocator<char>::~allocator((allocator<char> *)&local_621);
      local_48 = &main::_binlog_sid;
      local_50._M_i = local_568._M_i;
      local_54 = 5;
      local_58 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_60 = local_50._M_i;
      if ((local_54 != 3) && (local_54 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_50._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::
    addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[17],boost::container::basic_string<char,std::char_traits<char>,void>&>
              (in_stack_fffffffffffff1b0,(uint64_t)in_stack_fffffffffffff1a8,
               (uint64_t)in_stack_fffffffffffff1a0,(char (*) [17])in_stack_fffffffffffff198,
               (basic_string<char,_std::char_traits<char>,_void> *)0x104d85);
  }
  p = (int *)operator_new(4);
  *p = 1;
  boost::scoped_ptr<int>::scoped_ptr(&local_638,p);
  puVar15 = (undefined4 *)operator_new(4);
  *puVar15 = 2;
  boost::shared_ptr<int>::shared_ptr<int>
            ((shared_ptr<int> *)in_stack_fffffffffffff1c0,(int *)in_stack_fffffffffffff1b8);
  pSVar11 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar11);
  SVar9 = binlog::Session::minSeverity((Session *)0x104e26);
  cVar6._data[8] = local_718._data[8];
  cVar6._data[0] = local_718._data[0];
  cVar6._data[1] = local_718._data[1];
  cVar6._data[2] = local_718._data[2];
  cVar6._data[3] = local_718._data[3];
  cVar6._data[4] = local_718._data[4];
  cVar6._data[5] = local_718._data[5];
  cVar6._data[6] = local_718._data[6];
  cVar6._data[7] = local_718._data[7];
  acVar2[8] = local_728[8];
  acVar2[0] = local_728[0];
  acVar2[1] = local_728[1];
  acVar2[2] = local_728[2];
  acVar2[3] = local_728[3];
  acVar2[4] = local_728[4];
  acVar2[5] = local_728[5];
  acVar2[6] = local_728[6];
  acVar2[7] = local_728[7];
  if (SVar9 < 0x81) {
    local_110 = &main::_binlog_sid;
    local_114 = 0;
    local_118 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_120 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_650 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar11 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar11);
      local_708 = 0;
      local_700 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6f8,"main",&local_709);
      local_72d = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6d8,"main",&local_70a);
      local_72c = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_6b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingBoostTypes.cpp"
                 ,&local_70b);
      local_72b = 1;
      local_698 = 0x3a;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_690,"Boost pointers: {} {}",&local_70c);
      local_72a = 1;
      local_728 = (char  [9])
                  binlog::detail::
                  concatenated_tags<char_const(&)[22],boost::scoped_ptr<int>&,boost::shared_ptr<int>&>
                            ((char (*) [22])in_stack_fffffffffffff1d0,
                             (scoped_ptr<int> *)
                             CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8),
                             (shared_ptr<int> *)in_stack_fffffffffffff1c0);
      local_718 = (cx_string<8UL>)local_728;
      pacVar12 = mserialize::cx_string<8UL>::data(&local_718);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_670,*pacVar12,&local_729);
      local_72a = 0;
      local_72b = 0;
      local_72c = 0;
      local_72d = 0;
      local_650._M_i =
           binlog::Session::addEventSource
                     (in_stack_fffffffffffff1d0,
                      (EventSource *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      binlog::EventSource::~EventSource(in_stack_fffffffffffff1a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_729);
      std::allocator<char>::~allocator((allocator<char> *)&local_70c);
      std::allocator<char>::~allocator((allocator<char> *)&local_70b);
      std::allocator<char>::~allocator((allocator<char> *)&local_70a);
      std::allocator<char>::~allocator((allocator<char> *)&local_709);
      local_68 = &main::_binlog_sid;
      local_70._M_i = local_650._M_i;
      local_74 = 5;
      local_78 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_80 = local_70._M_i;
      if ((local_74 != 3) && (local_74 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_70._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::
    addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[22],boost::scoped_ptr<int>&,boost::shared_ptr<int>&>
              ((SessionWriter *)in_stack_fffffffffffff1c0,(uint64_t)in_stack_fffffffffffff1b8,
               (uint64_t)in_stack_fffffffffffff1b0,(char (*) [22])in_stack_fffffffffffff1a8,
               (scoped_ptr<int> *)in_stack_fffffffffffff1a0,in_stack_fffffffffffff198);
    acVar2 = local_728;
    cVar6._data = local_718._data;
  }
  local_728 = acVar2;
  local_718._data = cVar6._data;
  boost::shared_ptr<int>::reset((shared_ptr<int> *)in_stack_fffffffffffff1b0);
  pSVar11 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar11);
  SVar9 = binlog::Session::minSeverity((Session *)0x105500);
  cVar7._data[8] = local_800._data[8];
  cVar7._data[0] = local_800._data[0];
  cVar7._data[1] = local_800._data[1];
  cVar7._data[2] = local_800._data[2];
  cVar7._data[3] = local_800._data[3];
  cVar7._data[4] = local_800._data[4];
  cVar7._data[5] = local_800._data[5];
  cVar7._data[6] = local_800._data[6];
  cVar7._data[7] = local_800._data[7];
  acVar3[8] = local_818[8];
  acVar3[0] = local_818[0];
  acVar3[1] = local_818[1];
  acVar3[2] = local_818[2];
  acVar3[3] = local_818[3];
  acVar3[4] = local_818[4];
  acVar3[5] = local_818[5];
  acVar3[6] = local_818[6];
  acVar3[7] = local_818[7];
  if (SVar9 < 0x81) {
    local_128 = &main::_binlog_sid;
    local_12c = 0;
    local_130 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_138 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_738 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar11 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar11);
      local_7f0 = 0;
      local_7e8 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7e0,"main",&local_7f1);
      local_81d = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7c0,"main",&local_7f2);
      local_81c = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_7a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingBoostTypes.cpp"
                 ,&local_7f3);
      local_81b = 1;
      local_780 = 0x3e;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_778,"Empty Boost pointers: {} {}",&local_7f4);
      local_81a = 1;
      boost::scoped_ptr<bool>::scoped_ptr(&local_808,(bool *)0x0);
      local_818 = (char  [9])
                  binlog::detail::
                  concatenated_tags<char_const(&)[28],boost::scoped_ptr<bool>,boost::shared_ptr<int>&>
                            ((char (*) [28])in_stack_fffffffffffff1d0,
                             (scoped_ptr<bool> *)
                             CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8),
                             (shared_ptr<int> *)in_stack_fffffffffffff1c0);
      local_800 = (cx_string<8UL>)local_818;
      pacVar12 = mserialize::cx_string<8UL>::data(&local_800);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_758,*pacVar12,&local_819);
      local_81a = 0;
      local_81b = 0;
      local_81c = 0;
      local_81d = 0;
      local_738._M_i =
           binlog::Session::addEventSource
                     (in_stack_fffffffffffff1d0,
                      (EventSource *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      binlog::EventSource::~EventSource(in_stack_fffffffffffff1a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_819);
      boost::scoped_ptr<bool>::~scoped_ptr((scoped_ptr<bool> *)0x1058c5);
      std::allocator<char>::~allocator((allocator<char> *)&local_7f4);
      std::allocator<char>::~allocator((allocator<char> *)&local_7f3);
      std::allocator<char>::~allocator((allocator<char> *)&local_7f2);
      std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
      local_88 = &main::_binlog_sid;
      local_90._M_i = local_738._M_i;
      local_94 = 5;
      local_98 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_a0 = local_90._M_i;
      if ((local_94 != 3) && (local_94 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_90._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    boost::scoped_ptr<bool>::scoped_ptr(&local_828,(bool *)0x0);
    binlog::detail::
    addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[28],boost::scoped_ptr<bool>,boost::shared_ptr<int>&>
              ((SessionWriter *)in_stack_fffffffffffff1c0,(uint64_t)in_stack_fffffffffffff1b8,
               (uint64_t)in_stack_fffffffffffff1b0,(char (*) [28])in_stack_fffffffffffff1a8,
               (scoped_ptr<bool> *)in_stack_fffffffffffff1a0,in_stack_fffffffffffff198);
    boost::scoped_ptr<bool>::~scoped_ptr((scoped_ptr<bool> *)0x105bba);
    acVar3 = local_818;
    cVar7._data = local_800._data;
  }
  local_834 = 0x7b;
  local_818 = acVar3;
  local_800._data = cVar7._data;
  boost::optional<int>::optional
            ((optional<int> *)in_stack_fffffffffffff1b0,&in_stack_fffffffffffff1a8->first);
  boost::optional<int>::optional((optional<int> *)0x105c17);
  pSVar11 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar11);
  SVar9 = binlog::Session::minSeverity((Session *)0x105c4a);
  cVar8._data[8] = local_910._data[8];
  cVar8._data[0] = local_910._data[0];
  cVar8._data[1] = local_910._data[1];
  cVar8._data[2] = local_910._data[2];
  cVar8._data[3] = local_910._data[3];
  cVar8._data[4] = local_910._data[4];
  cVar8._data[5] = local_910._data[5];
  cVar8._data[6] = local_910._data[6];
  cVar8._data[7] = local_910._data[7];
  acVar4[8] = local_920[8];
  acVar4[0] = local_920[0];
  acVar4[1] = local_920[1];
  acVar4[2] = local_920[2];
  acVar4[3] = local_920[3];
  acVar4[4] = local_920[4];
  acVar4[5] = local_920[5];
  acVar4[6] = local_920[6];
  acVar4[7] = local_920[7];
  if (SVar9 < 0x81) {
    local_140 = &main::_binlog_sid;
    local_144 = 0;
    local_148 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_150 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_848 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar11 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar11);
      local_900 = 0;
      local_8f8 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8f0,"main",&local_901);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8d0,"main",&local_902);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_8b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingBoostTypes.cpp"
                 ,&local_903);
      local_890 = 0x4a;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_888,"Boost optionals: {} {}",&local_904);
      this = local_868;
      local_920 = (char  [9])
                  binlog::detail::
                  concatenated_tags<char_const(&)[23],boost::optional<int>&,boost::optional<int>&>
                            ((char (*) [23])in_stack_fffffffffffff1d0,
                             (optional<int> *)
                             CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8),
                             (optional<int> *)in_stack_fffffffffffff1c0);
      local_910 = (cx_string<8UL>)local_920;
      in_stack_fffffffffffff1e0 =
           (deque<int,_void,_void> *)mserialize::cx_string<8UL>::data(&local_910);
      paVar18 = &local_921;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(this,(char *)in_stack_fffffffffffff1e0,paVar18);
      local_848._M_i =
           binlog::Session::addEventSource
                     (in_stack_fffffffffffff1d0,
                      (EventSource *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8));
      binlog::EventSource::~EventSource(in_stack_fffffffffffff1a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_921);
      std::allocator<char>::~allocator((allocator<char> *)&local_904);
      std::allocator<char>::~allocator((allocator<char> *)&local_903);
      std::allocator<char>::~allocator((allocator<char> *)&local_902);
      std::allocator<char>::~allocator((allocator<char> *)&local_901);
      local_a8 = &main::_binlog_sid;
      local_b0 = (Session *)local_848._M_i;
      local_b4 = 5;
      in_stack_fffffffffffff1c0 = &main::_binlog_sid;
      local_b8 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_c0 = local_b0;
      if (local_b4 == 3) {
        ((SessionWriter *)in_stack_fffffffffffff1c0)->_session = local_b0;
      }
      else if (local_b4 == 5) {
        LOCK();
        ((SessionWriter *)in_stack_fffffffffffff1c0)->_session = local_b0;
        UNLOCK();
      }
      else {
        ((SessionWriter *)in_stack_fffffffffffff1c0)->_session = local_b0;
      }
    }
    pSVar11 = binlog::default_thread_local_writer();
    _Var17._M_i = local_848._M_i;
    in_stack_fffffffffffff1b0 = (SessionWriter *)binlog::clockNow();
    binlog::detail::
    addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[23],boost::optional<int>&,boost::optional<int>&>
              ((SessionWriter *)in_stack_fffffffffffff1c0,(uint64_t)pSVar11,
               (uint64_t)in_stack_fffffffffffff1b0,(char (*) [23])_Var17._M_i,
               (optional<int> *)in_stack_fffffffffffff1a0,(optional<int> *)in_stack_fffffffffffff198
              );
    acVar4 = local_920;
    cVar8._data = local_910._data;
  }
  local_920 = acVar4;
  local_910._data = cVar8._data;
  binlog::consume<std::ostream>
            ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1a0);
  local_154 = 0;
  boost::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x106280);
  boost::scoped_ptr<int>::~scoped_ptr((scoped_ptr<int> *)0x10628d);
  boost::container::basic_string<char,_std::char_traits<char>,_void>::~basic_string
            ((basic_string<char,_std::char_traits<char>,_void> *)0x10629a);
  boost::container::flat_set<int,_std::less<int>,_void>::~flat_set
            ((flat_set<int,_std::less<int>,_void> *)0x1062a7);
  boost::container::flat_map<int,_int,_std::less<int>,_void>::~flat_map
            ((flat_map<int,_int,_std::less<int>,_void> *)0x1062b4);
  boost::container::set<int,_std::less<int>,_void,_void>::~set
            ((set<int,_std::less<int>,_void,_void> *)0x1062c1);
  boost::container::map<int,_int,_std::less<int>,_void,_void>::~map
            ((map<int,_int,_std::less<int>,_void,_void> *)0x1062ce);
  boost::container::vector<int,_void,_void>::~vector
            ((vector<int,_void,_void> *)in_stack_fffffffffffff1b0);
  boost::container::slist<int,_void>::~slist((slist<int,_void> *)0x1062e8);
  boost::container::list<int,_void>::~list((list<int,_void> *)0x1062f5);
  boost::container::deque<int,_void,_void>::~deque(in_stack_fffffffffffff1e0);
  return local_154;
}

Assistant:

int main()
{
  // Boost containers - no specific adoption is required

  boost::container::deque<int> bdq{1,2,3};
  boost::container::list<int> bl{7,8,9};
  boost::container::slist<int> bsl{10,20,30};
  boost::container::vector<int> bv{};
  BINLOG_INFO("Boost sequence containers: {} {} {} {}", bdq, bl, bsl, bv);
  // Outputs: Boost sequence containers: [1, 2, 3] [7, 8, 9] [10, 20, 30] []

  boost::container::map<int,int> bm{{1,1},{2,4},{3,9}};
  boost::container::set<int> bs{4,5,6};
  boost::container::flat_map<int,int> bfm{{1,1},{2,4},{3,9}};
  boost::container::flat_set<int> bfs{2,3,5,8};
  BINLOG_INFO("Boost associative containers: {} {} {} {}", bm, bs, bfm, bfs);
  // Outputs: Boost associative containers: [(1, 1), (2, 4), (3, 9)] [4, 5, 6] [(1, 1), (2, 4), (3, 9)] [2, 3, 5, 8]

  // Boost string - no specific adoption is required

  boost::container::string str = "foo";
  BINLOG_INFO("Boost string: {}", str);
  // Outputs: Boost string: foo

  // Boost pointers - no specific adoption is required

  boost::scoped_ptr<int> bscoped(new int(1));
  boost::shared_ptr<int> bshared(new int(2));
  BINLOG_INFO("Boost pointers: {} {}", bscoped, bshared);
  // Outputs: Boost pointers: 1 2

  bshared.reset();
  BINLOG_INFO("Empty Boost pointers: {} {}", boost::scoped_ptr<bool>{}, bshared);
  // Outputs: Empty Boost pointers: {null} {null}

  static_assert(
    !mserialize::detail::is_serializable<boost::weak_ptr<int>>::value,
    "boost::weak_ptr is not loggable"
  );

  // Boost optional - loggable with the is_optional specialization above

  boost::optional<int> bopt(123);
  boost::optional<int> bemptyOpt;
  BINLOG_INFO("Boost optionals: {} {}", bopt, bemptyOpt);
  // Outputs: Boost optionals: 123 {null}

  binlog::consume(std::cout);
  return 0;
}